

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O3

void __thiscall
icu_63::UVector32::UVector32(UVector32 *this,int32_t initialCapacity,UErrorCode *status)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__UVector32_003b3790;
  this->count = 0;
  this->capacity = 0;
  this->maxCapacity = 0;
  this->elements = (int32_t *)0x0;
  _init(this,initialCapacity,status);
  return;
}

Assistant:

UVector32::UVector32(int32_t initialCapacity, UErrorCode &status) :
    count(0),
    capacity(0),
    maxCapacity(0),
    elements(0)
{
    _init(initialCapacity, status);
}